

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typesystem.cpp
# Opt level: O1

void __thiscall cxx::TypeGrammar::TypeGrammar(TypeGrammar *this)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  karma_rule<ast::IntegerInterval_()> *pkVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  adder *paVar5;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[13]>_>_>,_0L>
  that;
  string local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  string *local_f0;
  BuiltinType local_e4 [13];
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  undefined1 *local_68;
  char *local_60;
  undefined1 *local_58;
  char *local_50 [2];
  char **local_40;
  char **local_38;
  
  paVar4 = &local_118.field_2;
  local_118._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"unnamed-grammar","");
  (this->super_karma_grammar<ast::Type_()>).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::grammar<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = &this->type_;
  psVar1 = &(this->super_karma_grammar<ast::Type_()>).name_;
  paVar2 = &(this->super_karma_grammar<ast::Type_()>).name_.field_2;
  (this->super_karma_grammar<ast::Type_()>).name_._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)psVar1,local_118._M_dataplus._M_p,
             local_118._M_dataplus._M_p + local_118._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar4) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  local_118._M_dataplus._M_p = (pointer)paVar4;
  local_f8 = paVar2;
  local_f0 = psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"unnamed-rule","");
  (this->type_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = &this->type_;
  (this->type_).name_._M_dataplus._M_p = (pointer)&(this->type_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->type_).name_,local_118._M_dataplus._M_p,
             local_118._M_dataplus._M_p + local_118._M_string_length);
  (this->type_).f.
  super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar4) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  local_118._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"unnamed-rule","");
  pkVar3 = &this->integer_interval_;
  (this->integer_interval_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = pkVar3;
  (this->integer_interval_).name_._M_dataplus._M_p =
       (pointer)&(this->integer_interval_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->integer_interval_).name_,local_118._M_dataplus._M_p,
             local_118._M_dataplus._M_p + local_118._M_string_length);
  (this->integer_interval_).f.
  super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::IntegerInterval_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar4) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  local_118._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"symbols","");
  boost::spirit::karma::
  symbols<fidler::ast::BuiltinType,_const_char_*,_std::map<fidler::ast::BuiltinType,_const_char_*,_std::less<fidler::ast::BuiltinType>,_std::allocator<std::pair<const_fidler::ast::BuiltinType,_const_char_*>_>_>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::symbols(&this->builtin_type_,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar4) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  local_118._M_string_length =
       (size_type)
       (this->builtin_type_).
       super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<boost::spirit::karma::symbols<fidler::ast::BuiltinType,_const_char_*,_std::map<fidler::ast::BuiltinType,_const_char_*,_std::less<fidler::ast::BuiltinType>,_std::allocator<std::pair<const_fidler::ast::BuiltinType,_const_char_*>_>_>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::symbols<fidler::ast::BuiltinType,_const_char_*,_std::map<fidler::ast::BuiltinType,_const_char_*,_std::less<fidler::ast::BuiltinType>,_std::allocator<std::pair<const_fidler::ast::BuiltinType,_const_char_*>_>_>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
       .proto_expr_.child0.ref.t_;
  local_118._M_dataplus._M_p =
       (pointer)(pkVar3->
                super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
                ).proto_expr_.child0.ref.t_;
  boost::
  function<bool(boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,char,std::char_traits<char>>,mpl_::int_<15>,boost::spirit::unused_type>&,boost::spirit::context<boost::fusion::cons<boost::variant<fidler::ast::BuiltinType,fidler::ast::IntegerInterval,std::__cxx11::string>const&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
  ::operator=((function<bool(boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,char,std::char_traits<char>>,mpl_::int_<15>,boost::spirit::unused_type>&,boost::spirit::context<boost::fusion::cons<boost::variant<fidler::ast::BuiltinType,fidler::ast::IntegerInterval,std::__cxx11::string>const&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
               *)&(this->type_).f,
              (generator_binder<boost::spirit::karma::alternative<boost::fusion::cons<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>,_boost::fusion::cons<boost::spirit::karma::reference<boost::spirit::karma::symbols<fidler::ast::BuiltinType,_const_char_*,_std::map<fidler::ast::BuiltinType,_const_char_*,_std::less<fidler::ast::BuiltinType>,_std::allocator<std::pair<const_fidler::ast::BuiltinType,_const_char_*>_>_>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>,_boost::fusion::cons<boost::spirit::karma::any_string<boost::spirit::char_encoding::standard,_boost::spirit::unused_type>,_boost::fusion::nil_>_>_>_>,_mpl_::bool_<true>_>
               *)&local_118);
  local_40 = local_50;
  local_50[0] = "std::int32_t";
  local_38 = &local_60;
  local_60 = "";
  local_58 = &boost::spirit::int_;
  local_118._M_dataplus._M_p = (pointer)&local_40;
  local_118._M_string_length = (size_type)&local_70;
  local_70 = "";
  local_68 = &boost::spirit::int_;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::IntegerInterval(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[13]>>>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::omit>,0l>const&,boost::spirit::terminal<boost::spirit::tag::int_>const&>,2l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::omit>,0l>const&,boost::spirit::terminal<boost::spirit::tag::int_>const&>,2l>const&>,2l>>
            (pkVar3);
  local_e4[0xc] = 1;
  local_118._M_dataplus._M_p = "std::int8_t";
  paVar5 = boost::spirit::karma::
           symbols<fidler::ast::BuiltinType,char_const*,std::map<fidler::ast::BuiltinType,char_const*,std::less<fidler::ast::BuiltinType>,std::allocator<std::pair<fidler::ast::BuiltinType_const,char_const*>>>,boost::spirit::unused_type,boost::spirit::unused_type>
           ::adder::operator()(&(this->builtin_type_).add,local_e4 + 0xc,(char **)&local_118);
  local_e4[0xb] = 2;
  local_40 = (char **)0x3f9485;
  paVar5 = boost::spirit::karma::
           symbols<fidler::ast::BuiltinType,char_const*,std::map<fidler::ast::BuiltinType,char_const*,std::less<fidler::ast::BuiltinType>,std::allocator<std::pair<fidler::ast::BuiltinType_const,char_const*>>>,boost::spirit::unused_type,boost::spirit::unused_type>
           ::adder::operator()(paVar5,local_e4 + 0xb,(char **)&local_40);
  local_e4[10] = 3;
  local_50[0] = "std::int16_t";
  paVar5 = boost::spirit::karma::
           symbols<fidler::ast::BuiltinType,char_const*,std::map<fidler::ast::BuiltinType,char_const*,std::less<fidler::ast::BuiltinType>,std::allocator<std::pair<fidler::ast::BuiltinType_const,char_const*>>>,boost::spirit::unused_type,boost::spirit::unused_type>
           ::adder::operator()(paVar5,local_e4 + 10,local_50);
  local_e4[9] = 4;
  local_60 = "std::uint16_t";
  paVar5 = boost::spirit::karma::
           symbols<fidler::ast::BuiltinType,char_const*,std::map<fidler::ast::BuiltinType,char_const*,std::less<fidler::ast::BuiltinType>,std::allocator<std::pair<fidler::ast::BuiltinType_const,char_const*>>>,boost::spirit::unused_type,boost::spirit::unused_type>
           ::adder::operator()(paVar5,local_e4 + 9,&local_60);
  local_e4[8] = 5;
  local_70 = "std::int32_t";
  paVar5 = boost::spirit::karma::
           symbols<fidler::ast::BuiltinType,char_const*,std::map<fidler::ast::BuiltinType,char_const*,std::less<fidler::ast::BuiltinType>,std::allocator<std::pair<fidler::ast::BuiltinType_const,char_const*>>>,boost::spirit::unused_type,boost::spirit::unused_type>
           ::adder::operator()(paVar5,local_e4 + 8,&local_70);
  local_e4[7] = 6;
  local_78 = "std::uint32_t";
  paVar5 = boost::spirit::karma::
           symbols<fidler::ast::BuiltinType,char_const*,std::map<fidler::ast::BuiltinType,char_const*,std::less<fidler::ast::BuiltinType>,std::allocator<std::pair<fidler::ast::BuiltinType_const,char_const*>>>,boost::spirit::unused_type,boost::spirit::unused_type>
           ::adder::operator()(paVar5,local_e4 + 7,&local_78);
  local_e4[6] = 7;
  local_80 = "std::int64_t";
  paVar5 = boost::spirit::karma::
           symbols<fidler::ast::BuiltinType,char_const*,std::map<fidler::ast::BuiltinType,char_const*,std::less<fidler::ast::BuiltinType>,std::allocator<std::pair<fidler::ast::BuiltinType_const,char_const*>>>,boost::spirit::unused_type,boost::spirit::unused_type>
           ::adder::operator()(paVar5,local_e4 + 6,&local_80);
  local_e4[5] = 8;
  local_88 = "std::uint64_t";
  paVar5 = boost::spirit::karma::
           symbols<fidler::ast::BuiltinType,char_const*,std::map<fidler::ast::BuiltinType,char_const*,std::less<fidler::ast::BuiltinType>,std::allocator<std::pair<fidler::ast::BuiltinType_const,char_const*>>>,boost::spirit::unused_type,boost::spirit::unused_type>
           ::adder::operator()(paVar5,local_e4 + 5,&local_88);
  local_e4[4] = 9;
  local_90 = "bool";
  paVar5 = boost::spirit::karma::
           symbols<fidler::ast::BuiltinType,char_const*,std::map<fidler::ast::BuiltinType,char_const*,std::less<fidler::ast::BuiltinType>,std::allocator<std::pair<fidler::ast::BuiltinType_const,char_const*>>>,boost::spirit::unused_type,boost::spirit::unused_type>
           ::adder::operator()(paVar5,local_e4 + 4,&local_90);
  local_e4[3] = 10;
  local_98 = "std::string";
  paVar5 = boost::spirit::karma::
           symbols<fidler::ast::BuiltinType,char_const*,std::map<fidler::ast::BuiltinType,char_const*,std::less<fidler::ast::BuiltinType>,std::allocator<std::pair<fidler::ast::BuiltinType_const,char_const*>>>,boost::spirit::unused_type,boost::spirit::unused_type>
           ::adder::operator()(paVar5,local_e4 + 3,&local_98);
  local_e4[2] = 0xb;
  local_a0 = "float";
  paVar5 = boost::spirit::karma::
           symbols<fidler::ast::BuiltinType,char_const*,std::map<fidler::ast::BuiltinType,char_const*,std::less<fidler::ast::BuiltinType>,std::allocator<std::pair<fidler::ast::BuiltinType_const,char_const*>>>,boost::spirit::unused_type,boost::spirit::unused_type>
           ::adder::operator()(paVar5,local_e4 + 2,&local_a0);
  local_e4[1] = 0xc;
  local_a8 = "double";
  paVar5 = boost::spirit::karma::
           symbols<fidler::ast::BuiltinType,char_const*,std::map<fidler::ast::BuiltinType,char_const*,std::less<fidler::ast::BuiltinType>,std::allocator<std::pair<fidler::ast::BuiltinType_const,char_const*>>>,boost::spirit::unused_type,boost::spirit::unused_type>
           ::adder::operator()(paVar5,local_e4 + 1,&local_a8);
  local_e4[0] = ByteBuffer;
  local_b0 = "std::vector<std::uint8_t>";
  boost::spirit::karma::
  symbols<fidler::ast::BuiltinType,char_const*,std::map<fidler::ast::BuiltinType,char_const*,std::less<fidler::ast::BuiltinType>,std::allocator<std::pair<fidler::ast::BuiltinType_const,char_const*>>>,boost::spirit::unused_type,boost::spirit::unused_type>
  ::adder::operator()(paVar5,local_e4,&local_b0);
  return;
}

Assistant:

TypeGrammar::TypeGrammar() :
		TypeGrammar::base_type(type_)
{
	namespace karma = boost::spirit::karma;

	type_
		%= integer_interval_
		| builtin_type_
		| karma::string
		;

	integer_interval_
		%= karma::lit("std::int32_t")
		<< karma::omit[karma::int_]
		<< karma::omit[karma::int_]
		;

	builtin_type_.add
		(ast::BuiltinType::Int8,       "std::int8_t")
		(ast::BuiltinType::UInt8,      "std::uint8_t")
		(ast::BuiltinType::Int16,      "std::int16_t")
		(ast::BuiltinType::UInt16,     "std::uint16_t")
		(ast::BuiltinType::Int32,      "std::int32_t")
		(ast::BuiltinType::UInt32,     "std::uint32_t")
		(ast::BuiltinType::Int64,      "std::int64_t")
		(ast::BuiltinType::UInt64,     "std::uint64_t")
		(ast::BuiltinType::Boolean,    "bool")
		(ast::BuiltinType::String,     "std::string")
		(ast::BuiltinType::Float,      "float")
		(ast::BuiltinType::Double,     "double")
		(ast::BuiltinType::ByteBuffer, "std::vector<std::uint8_t>")
		;
}